

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateExtensionRegistrationSource
          (MessageGenerator *this,Printer *printer)

{
  pointer puVar1;
  pointer puVar2;
  unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
  *generator;
  pointer puVar3;
  pointer puVar4;
  
  puVar1 = (this->extension_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->extension_generators_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    ExtensionGenerator::GenerateRegistrationSource
              ((puVar3->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_false>
               ._M_head_impl,printer);
  }
  puVar2 = (this->nested_message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->nested_message_generators_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    GenerateExtensionRegistrationSource
              ((puVar4->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
               ._M_head_impl,printer);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateExtensionRegistrationSource(
    io::Printer* printer) {
  for (const auto& generator : extension_generators_) {
    generator->GenerateRegistrationSource(printer);
  }

  for (const auto& generator : nested_message_generators_) {
    generator->GenerateExtensionRegistrationSource(printer);
  }
}